

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFAcroFormDocumentHelper.cc
# Opt level: O0

void __thiscall
QPDFAcroFormDocumentHelper::generateAppearancesIfNeeded(QPDFAcroFormDocumentHelper *this)

{
  bool bVar1;
  undefined1 local_190 [16];
  string local_180;
  QPDFAnnotationObjectHelper local_160;
  undefined1 local_128 [8];
  QPDFFormFieldObjectHelper ffh;
  QPDFAnnotationObjectHelper *aoh;
  iterator __end2;
  iterator __begin2;
  vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_> local_a0;
  vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_> *local_88;
  vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_> *__range2;
  QPDFPageObjectHelper *page;
  __normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
  local_70;
  iterator __end1;
  iterator __begin1;
  QPDFPageDocumentHelper local_50;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> local_30;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *local_18;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *__range1;
  QPDFAcroFormDocumentHelper *this_local;
  
  __range1 = (vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)this;
  bVar1 = getNeedAppearances(this);
  if (bVar1) {
    QPDFPageDocumentHelper::QPDFPageDocumentHelper(&local_50,(this->super_QPDFDocumentHelper).qpdf);
    QPDFPageDocumentHelper::getAllPages(&local_30,&local_50);
    QPDFPageDocumentHelper::~QPDFPageDocumentHelper(&local_50);
    local_18 = &local_30;
    __end1 = std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::begin
                       (local_18);
    local_70._M_current =
         (QPDFPageObjectHelper *)
         std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::end(local_18);
    while (bVar1 = __gnu_cxx::operator!=(&__end1,&local_70), bVar1) {
      __range2 = (vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_> *)
                 __gnu_cxx::
                 __normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
                 ::operator*(&__end1);
      QPDFPageObjectHelper::QPDFPageObjectHelper
                ((QPDFPageObjectHelper *)&__begin2,(QPDFPageObjectHelper *)__range2);
      getWidgetAnnotationsForPage(&local_a0,this,(QPDFPageObjectHelper *)&__begin2);
      QPDFPageObjectHelper::~QPDFPageObjectHelper((QPDFPageObjectHelper *)&__begin2);
      local_88 = &local_a0;
      __end2 = std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>
               ::begin(local_88);
      aoh = (QPDFAnnotationObjectHelper *)
            std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>::
            end(local_88);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<QPDFAnnotationObjectHelper_*,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>_>
                                         *)&aoh), bVar1) {
        ffh.m.super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             __gnu_cxx::
             __normal_iterator<QPDFAnnotationObjectHelper_*,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>_>
             ::operator*(&__end2);
        QPDFAnnotationObjectHelper::QPDFAnnotationObjectHelper
                  (&local_160,
                   (QPDFAnnotationObjectHelper *)
                   ffh.m.
                   super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
        getFieldForAnnotation((QPDFFormFieldObjectHelper *)local_128,this,&local_160);
        QPDFAnnotationObjectHelper::~QPDFAnnotationObjectHelper(&local_160);
        QPDFFormFieldObjectHelper::getFieldType_abi_cxx11_
                  ((string *)(local_190 + 0x10),(QPDFFormFieldObjectHelper *)local_128);
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(local_190 + 0x10),"/Btn");
        std::__cxx11::string::~string((string *)(local_190 + 0x10));
        if (bVar1) {
          bVar1 = QPDFFormFieldObjectHelper::isRadioButton((QPDFFormFieldObjectHelper *)local_128);
          if ((bVar1) ||
             (bVar1 = QPDFFormFieldObjectHelper::isCheckbox((QPDFFormFieldObjectHelper *)local_128),
             bVar1)) {
            QPDFFormFieldObjectHelper::getValue((QPDFFormFieldObjectHelper *)local_190);
            QPDFFormFieldObjectHelper::setV
                      ((QPDFFormFieldObjectHelper *)local_128,(QPDFObjectHandle *)local_190,true);
            QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_190);
          }
        }
        else {
          QPDFFormFieldObjectHelper::generateAppearance
                    ((QPDFFormFieldObjectHelper *)local_128,
                     (QPDFAnnotationObjectHelper *)
                     ffh.m.
                     super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper
                  ((QPDFFormFieldObjectHelper *)local_128);
        __gnu_cxx::
        __normal_iterator<QPDFAnnotationObjectHelper_*,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>_>
        ::operator++(&__end2);
      }
      page._4_4_ = 4;
      std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>::~vector
                (&local_a0);
      __gnu_cxx::
      __normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
      ::operator++(&__end1);
    }
    page._4_4_ = 2;
    std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector(&local_30);
    setNeedAppearances(this,false);
  }
  return;
}

Assistant:

void
QPDFAcroFormDocumentHelper::generateAppearancesIfNeeded()
{
    if (!getNeedAppearances()) {
        return;
    }

    for (auto const& page: QPDFPageDocumentHelper(qpdf).getAllPages()) {
        for (auto& aoh: getWidgetAnnotationsForPage(page)) {
            QPDFFormFieldObjectHelper ffh = getFieldForAnnotation(aoh);
            if (ffh.getFieldType() == "/Btn") {
                // Rather than generating appearances for button fields, rely on what's already
                // there. Just make sure /AS is consistent with /V, which we can do by resetting the
                // value of the field back to itself. This code is referenced in a comment in
                // QPDFFormFieldObjectHelper::generateAppearance.
                if (ffh.isRadioButton() || ffh.isCheckbox()) {
                    ffh.setV(ffh.getValue());
                }
            } else {
                ffh.generateAppearance(aoh);
            }
        }
    }
    setNeedAppearances(false);
}